

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

uint32_t WriteBinaryNode(aiNode *node)

{
  uint32_t uVar1;
  uint i;
  ulong __size;
  uint32_t t;
  undefined4 local_5c;
  long local_58;
  ulong local_50;
  aiNode *local_48;
  float *local_40;
  float *local_38;
  
  local_5c = 0x123c;
  fwrite(&local_5c,4,1,(FILE *)out);
  fwrite(&local_5c,4,1,(FILE *)out);
  local_58 = ftell((FILE *)out);
  __size = (ulong)(node->mName).length;
  fwrite(node,4,1,(FILE *)out);
  local_50 = __size;
  fwrite((node->mName).data,__size,1,(FILE *)out);
  local_38 = &(node->mTransformation).d1;
  local_40 = &(node->mTransformation).c1;
  local_48 = node;
  fwrite(&node->mTransformation,4,1,(FILE *)out);
  uVar1 = (*(code *)&LAB_002ea5c1)(&node->mTransformation);
  return uVar1;
}

Assistant:

uint32_t WriteBinaryNode(const aiNode* node)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODE);
	len += Write<aiString>(node->mName);
	len += Write<aiMatrix4x4>(node->mTransformation);
	len += Write<unsigned int>(node->mNumChildren);
	len += Write<unsigned int>(node->mNumMeshes);

	for (unsigned int i = 0; i < node->mNumMeshes;++i) {
		len += Write<unsigned int>(node->mMeshes[i]);
	}

	for (unsigned int i = 0; i < node->mNumChildren;++i) {
		len += WriteBinaryNode(node->mChildren[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}